

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SecureDataManager.cpp
# Opt level: O2

void __thiscall SecureDataManager::encrypt(SecureDataManager *this,char *__block,int __edflag)

{
  RNG *pRVar1;
  SymmetricAlgorithm *pSVar2;
  int iVar3;
  size_t sVar4;
  undefined4 extraout_var;
  undefined4 in_register_00000014;
  ByteString *this_00;
  ByteString IV;
  ByteString local_e0;
  ByteString unmaskedKey;
  ByteString finalBlock;
  AESKey theKey;
  
  this_00 = (ByteString *)CONCAT44(in_register_00000014,__edflag);
  if (((this->userLoggedIn != false) || (this->soLoggedIn == true)) &&
     (sVar4 = ByteString::size(&this->maskedKey), sVar4 == 0x20)) {
    AESKey::AESKey(&theKey,0x100);
    ByteString::ByteString(&unmaskedKey);
    MutexLocker::MutexLocker((MutexLocker *)&IV,this->dataMgrMutex);
    unmask(this,&unmaskedKey);
    SymmetricKey::setKeyBits(&theKey.super_SymmetricKey,&unmaskedKey);
    remask(this,&unmaskedKey);
    MutexLocker::~MutexLocker((MutexLocker *)&IV);
    ByteString::wipe(this_00,0);
    ByteString::ByteString(&IV);
    pRVar1 = this->rng;
    iVar3 = (*this->aes->_vptr_SymmetricAlgorithm[0xd])();
    iVar3 = (*pRVar1->_vptr_RNG[2])(pRVar1,&IV,CONCAT44(extraout_var,iVar3));
    if ((char)iVar3 != '\0') {
      ByteString::ByteString(&finalBlock);
      pSVar2 = this->aes;
      ByteString::ByteString(&local_e0);
      iVar3 = (*pSVar2->_vptr_SymmetricAlgorithm[2])(pSVar2,&theKey,1,&IV,1,0,&local_e0,0);
      if (((char)iVar3 == '\0') ||
         (iVar3 = (*this->aes->_vptr_SymmetricAlgorithm[3])(this->aes,__block,this_00),
         (char)iVar3 == '\0')) {
        ByteString::~ByteString(&local_e0);
      }
      else {
        iVar3 = (*this->aes->_vptr_SymmetricAlgorithm[4])(this->aes,&finalBlock);
        ByteString::~ByteString(&local_e0);
        if ((char)iVar3 != '\0') {
          ByteString::operator+=(this_00,&finalBlock);
          operator+(&local_e0,&IV,this_00);
          ByteString::operator=(this_00,&local_e0);
          ByteString::~ByteString(&local_e0);
        }
      }
      ByteString::~ByteString(&finalBlock);
    }
    ByteString::~ByteString(&IV);
    ByteString::~ByteString(&unmaskedKey);
    SymmetricKey::~SymmetricKey(&theKey.super_SymmetricKey);
  }
  return;
}

Assistant:

bool SecureDataManager::encrypt(const ByteString& plaintext, ByteString& encrypted)
{
	// Check the object logged in state
	if ((!userLoggedIn && !soLoggedIn) || (maskedKey.size() != 32))
	{
		return false;
	}

	AESKey theKey(256);
	ByteString unmaskedKey;

	{
		MutexLocker lock(dataMgrMutex);

		unmask(unmaskedKey);

		theKey.setKeyBits(unmaskedKey);

		remask(unmaskedKey);
	}

	// Wipe encrypted data block
	encrypted.wipe();

	// Generate random IV
	ByteString IV;

	if (!rng->generateRandom(IV, aes->getBlockSize())) return false;

	ByteString finalBlock;

	if (!aes->encryptInit(&theKey, SymMode::CBC, IV) ||
	    !aes->encryptUpdate(plaintext, encrypted) ||
	    !aes->encryptFinal(finalBlock))
	{
		return false;
	}

	encrypted += finalBlock;

	// Add IV to output data
	encrypted = IV + encrypted;

	return true;
}